

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRuleParser::readWords(CollationRuleParser *this,int32_t i,UnicodeString *raw)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int8_t iVar4;
  ushort uVar5;
  uint i_00;
  UnicodeString *pUVar6;
  char16_t *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  char16_t cVar13;
  bool bVar14;
  UChar local_4e;
  uint local_4c;
  CollationRuleParser *local_48;
  UChar *local_40;
  
  uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = 2;
  if ((uVar1 & 1) == 0) {
    uVar5 = uVar1 & 0x1e;
  }
  (raw->fUnion).fStackFields.fLengthAndFlags = uVar5;
  i_00 = skipWhiteSpace(this,i);
  pUVar6 = this->rules;
  sVar2 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
  uVar10 = (uint)sVar2;
  if (sVar2 < 0) {
    uVar8 = (pUVar6->fUnion).fFields.fLength;
  }
  else {
    uVar8 = (int)uVar10 >> 5;
  }
  local_48 = this;
  if ((int)i_00 < (int)uVar8) {
    do {
      cVar13 = L'\xffff';
      if (i_00 < uVar8) {
        if ((uVar10 & 2) == 0) {
          pcVar7 = (pUVar6->fUnion).fFields.fArray;
        }
        else {
          pcVar7 = (char16_t *)((long)&pUVar6->fUnion + 2);
        }
        cVar13 = pcVar7[(int)i_00];
      }
      uVar10 = (uint)(ushort)cVar13;
      if ((ushort)cVar13 - 0x21 < 0x5e) {
        bVar14 = true;
        if ((0x2f < (ushort)cVar13) &&
           ((0x26 < (ushort)(cVar13 + L'ￆ') ||
            ((0x7e0000007fU >> ((ulong)(ushort)(cVar13 + L'ￆ') & 0x3f) & 1) == 0)))) {
          bVar14 = 0x7a < (ushort)cVar13;
        }
      }
      else {
        bVar14 = false;
      }
      if (((bVar14) && (cVar13 != L'-')) && (uVar10 != 0x5f)) {
        uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
        uVar8 = i_00;
        if (0x1f < uVar1) {
          if ((short)uVar1 < 0) {
            iVar11 = (raw->fUnion).fFields.fLength;
          }
          else {
            iVar11 = (int)(short)uVar1 >> 5;
          }
          iVar4 = UnicodeString::doCompare
                            (raw,iVar11 + -1,1,
                             L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥E硥数瑣摥愠爠獥瑥漠⁲敳瑴湩\x2067牯挠浯敭瑮爀獥瑥渠瑯映汯潬敷⁤祢愠爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068楤晦牥⁳牦浯椠獴映物瑳爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068潦汬睯摥戠⁹⁡瑳潲杮牥爠汥瑡潩n敲敳⁴楷桴畯⁴潰楳楴湯椀\x206e瀧敲楦籸瑳❲\x202c牰晥硩愠摮猠牴洠獵⁴慥档猠慴瑲眠瑩\x2068湡丠䍆戠畯摮牡y業獳湩\x2067瑳牡敲ⵤ敲慬楴湯猠牴湩g瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067獩渠瑯愠汬丠䑆椭敮瑲爀湡敧眠瑩潨瑵猠慴瑲椠\x206e瑳牡敲ⵤ敲慬楴湯猠牴湩g慲杮⁥楷桴畯⁴湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮爀湡敧猠慴瑲朠敲瑡牥琠慨\x206e湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧椠⁳潮⁴污\x206c䙎ⵄ湩牥t瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067慲杮⁥潣瑮楡獮愠猠牵潲慧整猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧挠湯慴湩⁳⭕䙆䑆\x202c⭕䙆䕆漠⁲⭕䙆䙆洀獩楳杮爠汥瑡潩\x206e瑳楲杮焀潵整⁤楬整慲\x206c整瑸洠獩楳杮琠牥業慮楴杮愠潰瑳潲桰e慢正汳獡\x2068獥慣数愠⁴桴⁥湥⁤景琠敨爠汵⁥瑳楲杮猀牴湩\x2067潣瑮楡獮愠\x206e湵慰物摥猠牵潲慧整猀牴湩\x2067潣瑮楡獮唠䘫䙆ⱄ唠䘫䙆⁅牯唠䘫䙆F潮⁴⁡慶楬⁤灳捥慩\x206c敲敳⁴潰楳楴湯攀灸捥整⁤⁡敳瑴湩⽧灯楴湯愠⁴嬧\'桛物条湡兡漠嵮椠⁳潮⁴畳灰牯整d硥数瑣摥氠湡畧条⁥慴\x2067湩嬠浩潰瑲氠湡呧条]楛灭牯⁴慬杮慔嵧椠⁳潮⁴畳灰牯整d楛灭牯⁴慬杮慔嵧映楡敬d潮⁴⁡慶楬⁤敳瑴湩⽧灯楴湯甀歮潮湷猠牣灩⁴牯爠潥摲牥挠摯e瑯敨獲甀扮污湡散⁤湕捩摯卥瑥瀠瑡整湲戠慲正瑥s潮⁴⁡慶楬⁤湕捩摯卥瑥瀠瑡整湲洀獩楳杮漠瑰潩⵮整浲湩瑡湩\x2067崧‧晡整⁲湕捩摯卥瑥瀠瑡整湲昀物瑳琠牥楴牡⁹杩潮慲汢e慬瑳琠牥楴牡⁹杩潮慲汢e楦獲⁴敳潣摮牡⁹杩潮慲汢e慬瑳猠捥湯慤祲椠湧牯扡敬昀物瑳瀠楲慭祲椠湧牯扡敬氀獡⁴牰浩牡⁹杩潮慲汢e楦獲⁴慶楲扡敬氀獡⁴慶楲扡敬昀物瑳爠来汵牡氀獡⁴敲畧慬r楦獲⁴浩汰捩瑩氀獡⁴浩汰捩瑩昀物瑳琠慲汩湩g慬瑳琠慲汩湩gvariable top"
                             ,0,1);
          this = local_48;
          local_40 = 
          L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥E硥数瑣摥愠爠獥瑥漠⁲敳瑴湩\x2067牯挠浯敭瑮爀獥瑥渠瑯映汯潬敷⁤祢愠爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068楤晦牥⁳牦浯椠獴映物瑳爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068潦汬睯摥戠⁹⁡瑳潲杮牥爠汥瑡潩n敲敳⁴楷桴畯⁴潰楳楴湯椀\x206e瀧敲楦籸瑳❲\x202c牰晥硩愠摮猠牴洠獵⁴慥档猠慴瑲眠瑩\x2068湡丠䍆戠畯摮牡y業獳湩\x2067瑳牡敲ⵤ敲慬楴湯猠牴湩g瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067獩渠瑯愠汬丠䑆椭敮瑲爀湡敧眠瑩潨瑵猠慴瑲椠\x206e瑳牡敲ⵤ敲慬楴湯猠牴湩g慲杮⁥楷桴畯⁴湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮爀湡敧猠慴瑲朠敲瑡牥琠慨\x206e湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧椠⁳潮⁴污\x206c䙎ⵄ湩牥t瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067慲杮⁥潣瑮楡獮愠猠牵潲慧整猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧挠湯慴湩⁳⭕䙆䑆\x202c⭕䙆䕆漠⁲⭕䙆䙆洀獩楳杮爠汥瑡潩\x206e瑳楲杮焀潵整⁤楬整慲\x206c整瑸洠獩楳杮琠牥業慮楴杮愠潰瑳潲桰e慢正汳獡\x2068獥慣数愠⁴桴⁥湥⁤景琠敨爠汵⁥瑳楲杮猀牴湩\x2067潣瑮楡獮愠\x206e湵慰物摥猠牵潲慧整猀牴湩\x2067潣瑮楡獮唠䘫䙆ⱄ唠䘫䙆⁅牯唠䘫䙆F潮⁴⁡慶楬⁤灳捥慩\x206c敲敳⁴潰楳楴湯攀灸捥整⁤⁡敳瑴湩⽧灯楴湯愠⁴嬧\'桛物条湡兡漠嵮椠⁳潮⁴畳灰牯整d硥数瑣摥氠湡畧条⁥慴\x2067湩嬠浩潰瑲氠湡呧条]楛灭牯⁴慬杮慔嵧椠⁳潮⁴畳灰牯整d楛灭牯⁴慬杮慔嵧映楡敬d潮⁴⁡慶楬⁤敳瑴湩⽧灯楴湯甀歮潮湷猠牣灩⁴牯爠潥摲牥挠摯e瑯敨獲甀扮污湡散⁤湕捩摯卥瑥瀠瑡整湲戠慲正瑥s潮⁴⁡慶楬⁤湕捩摯卥瑥瀠瑡整湲洀獩楳杮漠瑰潩⵮整浲湩瑡湩\x2067崧‧晡整⁲湕捩摯卥瑥瀠瑡整湲昀物瑳琠牥楴牡⁹杩潮慲汢e慬瑳琠牥楴牡⁹杩潮慲汢e楦獲⁴敳潣摮牡⁹杩潮慲汢e慬瑳猠捥湯慤祲椠湧牯扡敬昀物瑳瀠楲慭祲椠湧牯扡敬氀獡⁴牰浩牡⁹杩潮慲汢e楦獲⁴慶楲扡敬氀獡⁴慶楲扡敬昀物瑳爠来汵牡氀獡⁴敲畧慬r楦獲⁴浩汰捩瑩氀獡⁴浩汰捩瑩昀物瑳琠慲汩湩g慬瑳琠慲汩湩gvariable top"
          ;
          if (iVar4 == '\0') {
            uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
            if ((short)uVar1 < 0) {
              iVar9 = (raw->fUnion).fFields.fLength;
            }
            else {
              iVar9 = (int)(short)uVar1 >> 5;
            }
            iVar12 = iVar9 + -1;
            if (iVar12 == 0 && ((int)(short)uVar1 & 1U) != 0) {
              UnicodeString::unBogus(raw);
            }
            else if (iVar9 != 0) {
              if (iVar9 < 0x401) {
                (raw->fUnion).fStackFields.fLengthAndFlags = (short)iVar12 * 0x20 | uVar1 & 0x1f;
              }
              else {
                (raw->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
                (raw->fUnion).fFields.fLength = iVar12;
              }
            }
          }
        }
      }
      else {
        UVar3 = PatternProps::isWhiteSpace(uVar10);
        i_00 = i_00 + 1;
        if (UVar3 == '\0') {
          local_4e = cVar13;
          UnicodeString::doAppend(raw,&local_4e,0,1);
          uVar8 = local_4c;
        }
        else {
          local_4e = L' ';
          UnicodeString::doAppend(raw,&local_4e,0,1);
          i_00 = skipWhiteSpace(this,i_00);
          uVar8 = local_4c;
        }
      }
      local_4c = uVar8;
      if (((bVar14) && (cVar13 != L'-')) && (uVar10 != 0x5f)) {
        return local_4c;
      }
      pUVar6 = this->rules;
      sVar2 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
      uVar10 = (uint)sVar2;
      if (sVar2 < 0) {
        uVar8 = (pUVar6->fUnion).fFields.fLength;
      }
      else {
        uVar8 = (int)uVar10 >> 5;
      }
    } while ((int)i_00 < (int)uVar8);
  }
  return 0;
}

Assistant:

int32_t
CollationRuleParser::readWords(int32_t i, UnicodeString &raw) const {
    static const UChar sp = 0x20;
    raw.remove();
    i = skipWhiteSpace(i);
    for(;;) {
        if(i >= rules->length()) { return 0; }
        UChar c = rules->charAt(i);
        if(isSyntaxChar(c) && c != 0x2d && c != 0x5f) {  // syntax except -_
            if(raw.isEmpty()) { return i; }
            if(raw.endsWith(&sp, 1)) {  // remove trailing space
                raw.truncate(raw.length() - 1);
            }
            return i;
        }
        if(PatternProps::isWhiteSpace(c)) {
            raw.append(sp);
            i = skipWhiteSpace(i + 1);
        } else {
            raw.append(c);
            ++i;
        }
    }
}